

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_sse4.cpp
# Opt level: O3

void storeRGBx64FromRGBA64PM_sse4
               (uchar *dest,QRgba64 *src,int index,int count,QList<unsigned_int> *param_5,
               QDitherInfo *param_6)

{
  long lVar1;
  undefined1 auVar2 [16];
  long lVar3;
  QRgba64 QVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  QRgba64 *this;
  long in_FS_OFFSET;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar10 [16];
  float fVar11;
  float fVar13;
  float fVar14;
  undefined1 auVar12 [16];
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar23 [16];
  
  auVar2 = _DAT_00674850;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = (long)index;
  if ((MXCSR & 0x80) == 0) {
    if (0 < count) {
      lVar7 = 0;
      do {
        QVar4 = QRgba64::unpremultiplied((QRgba64 *)((long)&src->rgba + lVar7));
        *(quint64 *)(dest + lVar7 + lVar3 * 8) = QVar4.rgba | 0xffff000000000000;
        lVar7 = lVar7 + 8;
      } while ((ulong)(uint)count << 3 != lVar7);
    }
  }
  else {
    uVar6 = 0;
    if (3 < count) {
      uVar6 = 0;
      auVar10 = pmovsxbw(in_XMM2,0xff000000ff000000);
      do {
        auVar9 = *(undefined1 (*) [16])(src + uVar6 + 2);
        auVar8 = *(undefined1 (*) [16])(src + uVar6);
        if ((auVar10 & auVar8) == (undefined1  [16])0x0) {
          auVar12 = (undefined1  [16])0x0;
          auVar16 = (undefined1  [16])0x0;
          if ((auVar10 & auVar9) != (undefined1  [16])0x0) goto LAB_005acf1d;
        }
        else {
LAB_005acf1d:
          if (((auVar10 & ~auVar9) == (undefined1  [16])0x0) &&
             ((auVar10 & ~auVar8) == (undefined1  [16])0x0)) {
            auVar12 = auVar8 | auVar10;
            auVar16 = auVar9 | auVar10;
          }
          else {
            auVar16._0_8_ = auVar8._0_8_ >> 0x30;
            auVar16._8_8_ = auVar8._8_8_ >> 0x30;
            auVar17._0_8_ = auVar9._0_8_ >> 0x30;
            auVar17._8_8_ = auVar9._8_8_ >> 0x30;
            auVar12 = packusdw(auVar16,auVar17);
            auVar18._0_4_ = (float)auVar12._0_4_;
            auVar18._4_4_ = (float)auVar12._4_4_;
            auVar18._8_4_ = (float)auVar12._8_4_;
            auVar18._12_4_ = (float)auVar12._12_4_;
            auVar12 = rcpps(auVar12,auVar18);
            fVar11 = auVar12._0_4_;
            fVar13 = auVar12._4_4_;
            fVar14 = auVar12._8_4_;
            fVar15 = auVar12._12_4_;
            auVar19._0_4_ = auVar18._0_4_ * fVar11 * fVar11;
            auVar19._4_4_ = auVar18._4_4_ * fVar13 * fVar13;
            auVar19._8_4_ = auVar18._8_4_ * fVar14 * fVar14;
            auVar19._12_4_ = auVar18._12_4_ * fVar15 * fVar15;
            fVar11 = ((fVar11 + fVar11) - auVar19._0_4_) * 65535.0;
            fVar13 = ((fVar13 + fVar13) - auVar19._4_4_) * 65535.0;
            fVar14 = ((fVar14 + fVar14) - auVar19._8_4_) * 65535.0;
            fVar15 = ((fVar15 + fVar15) - auVar19._12_4_) * 65535.0;
            auVar12 = pmovzxwd(auVar19,auVar8);
            auVar23 = pmovzxwd(in_XMM10,auVar9);
            auVar20._0_4_ = (int)((float)auVar12._0_4_ * fVar11);
            auVar20._4_4_ = (int)((float)auVar12._4_4_ * fVar11);
            auVar20._8_4_ = (int)((float)auVar12._8_4_ * fVar11);
            auVar20._12_4_ = (int)((float)auVar12._12_4_ * fVar11);
            auVar21._0_4_ = (int)((float)auVar8._8_2_ * fVar13);
            auVar21._4_4_ = (int)((float)auVar8._10_2_ * fVar13);
            auVar21._8_4_ = (int)((float)auVar8._12_2_ * fVar13);
            auVar21._12_4_ = (int)((float)auVar8._14_2_ * fVar13);
            auVar16 = packusdw(auVar20,auVar21);
            auVar22._0_4_ = (int)((float)auVar23._0_4_ * fVar14);
            auVar22._4_4_ = (int)((float)auVar23._4_4_ * fVar14);
            auVar22._8_4_ = (int)((float)auVar23._8_4_ * fVar14);
            auVar22._12_4_ = (int)((float)auVar23._12_4_ * fVar14);
            in_XMM10._0_4_ = (float)auVar9._8_2_ * fVar15;
            in_XMM10._4_4_ = (float)auVar9._10_2_ * fVar15;
            in_XMM10._8_4_ = (float)auVar9._12_2_ * fVar15;
            in_XMM10._12_4_ = (float)auVar9._14_2_ * fVar15;
            auVar23._0_4_ = (int)in_XMM10._0_4_;
            auVar23._4_4_ = (int)in_XMM10._4_4_;
            auVar23._8_4_ = (int)in_XMM10._8_4_;
            auVar23._12_4_ = (int)in_XMM10._12_4_;
            auVar23 = packusdw(auVar22,auVar23);
            auVar8 = auVar8 ^ auVar2;
            auVar12._0_4_ = -(uint)(-0x7fff0001 < auVar8._0_4_);
            auVar12._4_4_ = -(uint)(-0x7fff0001 < auVar8._4_4_);
            auVar12._8_4_ = -(uint)(-0x7fff0001 < auVar8._8_4_);
            auVar12._12_4_ = -(uint)(-0x7fff0001 < auVar8._12_4_);
            auVar9 = auVar9 ^ auVar2;
            auVar8._0_4_ = -(uint)(-0x7fff0001 < auVar9._0_4_);
            auVar8._4_4_ = -(uint)(-0x7fff0001 < auVar9._4_4_);
            auVar8._8_4_ = -(uint)(-0x7fff0001 < auVar9._8_4_);
            auVar8._12_4_ = -(uint)(-0x7fff0001 < auVar9._12_4_);
            auVar12 = blendvpd(auVar10,auVar16 | auVar10,auVar12);
            auVar16 = blendvpd(auVar10,auVar23 | auVar10,auVar8);
          }
        }
        *(undefined1 (*) [16])(dest + uVar6 * 8 + lVar3 * 8) = auVar12;
        *(undefined1 (*) [16])(dest + uVar6 * 8 + lVar3 * 8 + 0x10) = auVar16;
        uVar6 = uVar6 + 4;
      } while (uVar6 < count - 3);
    }
    if ((int)uVar6 < count) {
      uVar6 = uVar6 & 0xffffffff;
      this = src + uVar6;
      lVar7 = 0;
      do {
        QVar4 = QRgba64::unpremultiplied(this);
        *(quint64 *)(dest + lVar7 * 8 + uVar6 * 8 + lVar3 * 8) = QVar4.rgba | 0xffff000000000000;
        if (1 < (uint)lVar7) break;
        lVar5 = uVar6 + 1 + lVar7;
        lVar7 = lVar7 + 1;
        this = this + 1;
      } while (lVar5 < count);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QT_FASTCALL storeRGBx64FromRGBA64PM_sse4(uchar *dest, const QRgba64 *src, int index, int count,
                                              const QList<QRgb> *, QDitherInfo *)
{
    QRgba64 *d = (QRgba64 *)dest + index;
    convertRGBA64FromRGBA64PM_sse4<true>(d, src, count);
}